

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleMesh.h
# Opt level: O0

void __thiscall
SimpleMesh<TextureVertex>::SimpleMesh
          (SimpleMesh<TextureVertex> *this,
          vector<TextureVertex,_std::allocator<TextureVertex>_> *vertices,
          vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *indices)

{
  vector<TextureVertex,_std::allocator<TextureVertex>_> *in_stack_00000018;
  
  std::vector<TextureVertex,_std::allocator<TextureVertex>_>::vector
            ((vector<TextureVertex,_std::allocator<TextureVertex>_> *)indices,in_stack_00000018);
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            (indices,(vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                     in_stack_00000018);
  return;
}

Assistant:

SimpleMesh(const std::vector<V> &vertices, const std::vector<std::array<int, 3>> &indices) : vertices(
            vertices), indices(indices) {}